

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void S_StopSound(FPolyObj *poly,int channel)

{
  FSoundChan *pFVar1;
  FSoundChan *chan;
  
  pFVar1 = Channels;
  while (chan = pFVar1, chan != (FSoundChan *)0x0) {
    pFVar1 = chan->NextChan;
    if (((chan->SourceType == '\x03') && ((chan->field_12).Actor == (AActor *)poly)) &&
       (((uint)chan->EntChannel == channel || (((byte)i_compatflags & 0x20) != 0)))) {
      S_StopChannel(chan);
    }
  }
  return;
}

Assistant:

void S_StopSound (const FPolyObj *poly, int channel)
{
	FSoundChan *chan = Channels;
	while (chan != NULL)
	{
		FSoundChan *next = chan->NextChan;
		if (chan->SourceType == SOURCE_Polyobj &&
			chan->Poly == poly &&
			(chan->EntChannel == channel || (i_compatflags & COMPATF_MAGICSILENCE)))
		{
			S_StopChannel(chan);
		}
		chan = next;
	}
}